

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O2

_Bool xdr_nrejected_reply(XDR *xdrs,rejected_reply *rr)

{
  uint __line;
  _Bool _Var1;
  bool_t bVar2;
  char *__assertion;
  
  if (xdrs == (XDR *)0x0) {
    __assertion = "xdrs != NULL";
    __line = 0x6f;
  }
  else {
    if (rr != (rejected_reply *)0x0) {
      bVar2 = xdr_enum((XDR *)xdrs,(enum_t *)rr);
      if ((char)bVar2 != '\0') {
        if (rr->rj_stat == AUTH_ERROR) {
          bVar2 = xdr_enum((XDR *)xdrs,(enum_t *)&(rr->ru).RJ_why);
          return SUB41(bVar2,0);
        }
        if (rr->rj_stat != RPC_MISMATCH) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                        ,0x80,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
        }
        _Var1 = xdr_u_int32_t(xdrs,&(rr->ru).RJ_why);
        if (_Var1) {
          _Var1 = xdr_u_int32_t(xdrs,&(rr->ru).RJ_versions.high);
          return _Var1;
        }
      }
      return false;
    }
    __assertion = "rr != NULL";
    __line = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,__line,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
}

Assistant:

bool
xdr_nrejected_reply(XDR *xdrs, struct rejected_reply *rr)
{
	assert(xdrs != NULL);
	assert(rr != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!inline_xdr_enum(xdrs, (enum_t *) &(rr->rj_stat)))
		return (false);
	switch (rr->rj_stat) {

	case RPC_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(rr->rj_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(rr->rj_vers.high)));

	case AUTH_ERROR:
		return (inline_xdr_enum(xdrs, (enum_t *) &(rr->rj_why)));
	}
	/* NOTREACHED */
	assert(0);
	return (false);
}